

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_binary_frame_within_text_fragments(void)

{
  cio_error cVar1;
  uint local_c0;
  uint i;
  cio_error err;
  ws_frame frames [5];
  char data [12];
  
  memset(&frames[4].field_0x1c,0x61,0xc);
  i = 1;
  err = CIO_SUCCESS;
  frames[0]._0_8_ = &frames[4].field_0x1c;
  frames[0].data = (void *)0xc;
  frames[0].data_length._0_1_ = 0;
  frames[0].data_length._1_1_ = 0;
  frames[0].last_frame = false;
  frames[0].rsv = false;
  frames[0]._26_2_ = 0;
  frames[0]._28_4_ = 0;
  frames[1]._0_8_ = &frames[4].field_0x1c;
  frames[1].data = (void *)0xc;
  frames[1].data_length._0_1_ = 0;
  frames[1].data_length._1_1_ = 0;
  frames[1].last_frame = true;
  frames[1].rsv = false;
  frames[1]._26_2_ = 0;
  frames[1]._28_4_ = 0;
  frames[2]._0_8_ = &frames[4].field_0x1c;
  frames[2].data = (void *)0xc;
  frames[2].data_length._0_1_ = 1;
  frames[2].data_length._1_1_ = 0;
  frames[2].last_frame = false;
  frames[2].rsv = false;
  frames[2]._26_2_ = 0;
  frames[2]._28_4_ = 0;
  frames[3]._0_8_ = &frames[4].field_0x1c;
  frames[3].data = (void *)0xc;
  frames[3].data_length._0_1_ = 1;
  frames[3].data_length._1_1_ = 0;
  frames[3].last_frame = true;
  frames[3].rsv = false;
  frames[3]._26_2_ = 0;
  frames[3]._28_4_ = 0;
  frames[4].frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME;
  frames[4].direction = FROM_CLIENT;
  frames[4].data = (void *)0x0;
  frames[4].data_length._0_1_ = 1;
  frames[4].data_length._1_1_ = 0;
  serialize_frames((ws_frame *)&i,5);
  *(ushort *)&(ws->ws_private).ws_flags =
       *(ushort *)&(ws->ws_private).ws_flags & 0xfbff | (ushort)(err == CIO_SUCCESS) << 10;
  cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x6c6,UNITY_DISPLAY_STYLE_INT);
  UnityAssertGreaterOrLessOrEqualNumber
            (3,(ulong)read_handler_fake.call_count,UNITY_GREATER_OR_EQUAL,
             "number of read_handler callbacks called not correct",0x6c8,UNITY_DISPLAY_STYLE_INT);
  local_c0 = 0;
  while( true ) {
    if (read_handler_fake.call_count - 1 <= local_c0) {
      UnityAssertEqualNumber
                ((UNITY_INT)ws,
                 (UNITY_INT)read_handler_fake.arg0_history[read_handler_fake.call_count - 1],
                 "websocket parameter of read_handler not correct",0x6d4,UNITY_DISPLAY_STYLE_HEX64);
      if (read_handler_fake.arg1_history[read_handler_fake.call_count - 1] == (void *)0x0) {
        UnityAssertEqualNumber
                  (1,(long)read_handler_fake.arg2_history[read_handler_fake.call_count - 1],
                   "err parameter of read_handler not correct",0x6d6,UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (1,(ulong)on_error_fake.call_count,"error callback was not called",0x6d8,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (0,(ulong)on_control_fake.call_count,"control callback was called for close frame"
                   ,0x6da,UNITY_DISPLAY_STYLE_INT);
        return;
      }
      UnityFail("context parameter of read_handler not correct",0x6d5);
    }
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[local_c0],
               "websocket parameter of read_handler not correct",0x6cb,UNITY_DISPLAY_STYLE_HEX64);
    if (read_handler_fake.arg1_history[local_c0] != (void *)0x0) {
      UnityFail("context parameter of read_handler not correct",0x6cc);
    }
    UnityAssertEqualNumber
              (0,(long)read_handler_fake.arg2_history[local_c0],
               "err parameter of read_handler not correct",0x6cd,UNITY_DISPLAY_STYLE_INT);
    if (read_handler_fake.arg4_history[local_c0] == (uint8_t *)0x0) {
      UnityFail("data parameter of read_handler not correct",0x6ce);
    }
    UnityAssertEqualNumber
              (0xc,read_handler_fake.arg5_history[local_c0],
               "length parameter of read_handler not correct",0x6cf,UNITY_DISPLAY_STYLE_INT);
    if ((read_handler_fake.arg7_history[local_c0] & 1U) != 0) break;
    if ((read_handler_fake.arg8_history[local_c0] & 1U) != 0) {
      UnityFail("is_binary parameter of read_handler not correct",0x6d1);
    }
    local_c0 = local_c0 + 1;
  }
  UnityFail("last_frame parameter of read_handler not correct",0x6d0);
}

Assistant:

static void test_binary_frame_within_text_fragments(void)
{
	char data[12];
	memset(data, 'a', sizeof(data));

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_TEXT_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_BINARY_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_GREATER_OR_EQUAL_MESSAGE(3, read_handler_fake.call_count, "number of read_handler callbacks called not correct");

	for (unsigned int i = 0; i < read_handler_fake.call_count - 1; i++) {
		TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_history[i], "websocket parameter of read_handler not correct");
		TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[i], "context parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, read_handler_fake.arg2_history[i], "err parameter of read_handler not correct");
		TEST_ASSERT_NOT_NULL_MESSAGE(read_handler_fake.arg4_history[i], "data parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(sizeof(data), read_handler_fake.arg5_history[i], "length parameter of read_handler not correct");
		TEST_ASSERT_FALSE_MESSAGE(read_handler_fake.arg7_history[i], "last_frame parameter of read_handler not correct");
		TEST_ASSERT_FALSE_MESSAGE(read_handler_fake.arg8_history[i], "is_binary parameter of read_handler not correct");
	}

	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_history[read_handler_fake.call_count - 1], "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[read_handler_fake.call_count - 1], "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[read_handler_fake.call_count - 1], "err parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.call_count, "control callback was called for close frame");
}